

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqliteBuiltin_collection_exists(jx9_context *pCtx,int argc,jx9_value **argv)

{
  int iVar1;
  int local_4c;
  int rc;
  int nByte;
  SyString sName;
  unqlite_vm *pVm;
  char *zName;
  jx9_value **argv_local;
  int argc_local;
  jx9_context *pCtx_local;
  
  if (argc < 1) {
    jx9_context_throw_error(pCtx,1,"Missing collection name");
    jx9_result_bool(pCtx,0);
  }
  else {
    _rc = jx9_value_to_string(*argv,&local_4c);
    if (local_4c < 1) {
      jx9_context_throw_error(pCtx,1,"Invalid collection name");
      jx9_result_bool(pCtx,0);
    }
    else {
      sName.zString._0_4_ = local_4c;
      sName._8_8_ = jx9_context_user_data(pCtx);
      iVar1 = unqliteExistsCollection((unqlite_vm *)sName._8_8_,(SyString *)&rc);
      jx9_result_bool(pCtx,(uint)(iVar1 == 0));
    }
  }
  return 0;
}

Assistant:

static int unqliteBuiltin_collection_exists(jx9_context *pCtx,int argc,jx9_value **argv)
{
	const char *zName;
	unqlite_vm *pVm;
	SyString sName;
	int nByte;
	int rc;
	/* Extract collection name */
	if( argc < 1 ){
		/* Missing arguments */
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Missing collection name");
		/* Return false */
		jx9_result_bool(pCtx,0);
		return JX9_OK;
	}
	zName = jx9_value_to_string(argv[0],&nByte);
	if( nByte < 1){
		jx9_context_throw_error(pCtx,JX9_CTX_ERR,"Invalid collection name");
		/* Return false */
		jx9_result_bool(pCtx,0);
		return JX9_OK;
	}
	SyStringInitFromBuf(&sName,zName,nByte);
	pVm = (unqlite_vm *)jx9_context_user_data(pCtx);
	/* Perform the lookup */
	rc = unqliteExistsCollection(pVm, &sName);
	/* Lookup result */
	jx9_result_bool(pCtx, rc == UNQLITE_OK ? 1 : 0);
	return JX9_OK;
}